

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_tree.cpp
# Opt level: O0

void __thiscall
HuffTree::HuffTree(HuffTree *this,
                  unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
                  *data)

{
  int iVar1;
  bool bVar2;
  undefined1 uVar3;
  reference pvVar4;
  pointer pTVar5;
  const_reference pvVar6;
  size_type sVar7;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  int freq_1;
  unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> top;
  int freq;
  unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> r;
  unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> l;
  size_t size;
  value_type i;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
  *__range1;
  priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_jeinygroove[P]Huffman_Archiver_src_huffman_tree_cpp:14:17)>
  MinHeap;
  anon_class_1_0_00000001 comp;
  unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
  *in_stack_fffffffffffffdd8;
  unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *puVar8;
  undefined4 in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  TreeNode *in_stack_fffffffffffffde8;
  TreeNode *__args;
  priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_jeinygroove[P]Huffman_Archiver_src_huffman_tree_cpp:14:17)>
  *in_stack_fffffffffffffdf0;
  undefined1 is_leaf;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  undefined4 uVar9;
  priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_jeinygroove[P]Huffman_Archiver_src_huffman_tree_cpp:14:17)>
  *in_stack_fffffffffffffe00;
  anon_class_1_0_00000001 *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  undefined1 local_160 [8];
  TreeNode local_158;
  int local_124;
  unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> local_120 [8];
  int local_dc;
  ulong local_c8;
  value_type local_88;
  _Node_iterator_base<std::pair<const_char,_int>,_false> local_80;
  _Node_iterator_base<std::pair<const_char,_int>,_false> local_78;
  undefined8 local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_10;
  
  *in_RDI = 0;
  local_10 = in_RSI;
  std::unique_ptr<HuffTree::TreeNode,std::default_delete<HuffTree::TreeNode>>::
  unique_ptr<std::default_delete<HuffTree::TreeNode>,void>
            ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  std::
  vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
  ::vector((vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
            *)0x11a50b);
  std::
  priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/src/huffman_tree.cpp:14:17)>
  ::priority_queue((priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_jeinygroove[P]Huffman_Archiver_src_huffman_tree_cpp:14:17)>
                    *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                   in_stack_fffffffffffffe08,&in_stack_fffffffffffffe00->c);
  std::
  vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
  ::~vector(&in_stack_fffffffffffffdf0->c);
  local_70 = local_10;
  local_78._M_cur =
       (__node_type *)
       std::
       unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
       ::begin(in_stack_fffffffffffffdd8);
  local_80._M_cur =
       (__node_type *)
       std::
       unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
       ::end(in_stack_fffffffffffffdd8);
  while( true ) {
    bVar2 = std::__detail::operator!=(&local_78,&local_80);
    if (!bVar2) break;
    pvVar4 = std::__detail::_Node_const_iterator<std::pair<const_char,_int>,_false,_false>::
             operator*((_Node_const_iterator<std::pair<const_char,_int>,_false,_false> *)0x11a59c);
    local_88 = *pvVar4;
    std::unique_ptr<HuffTree::TreeNode,std::default_delete<HuffTree::TreeNode>>::
    unique_ptr<std::default_delete<HuffTree::TreeNode>,void>
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffdd8);
    std::unique_ptr<HuffTree::TreeNode,std::default_delete<HuffTree::TreeNode>>::
    unique_ptr<std::default_delete<HuffTree::TreeNode>,void>
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffdd8);
    TreeNode::TreeNode((TreeNode *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                       (char)((ulong)in_stack_fffffffffffffe08 >> 0x38),
                       (int)in_stack_fffffffffffffe08,
                       (unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                       in_stack_fffffffffffffe00,
                       (unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                       CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                       SUB81((ulong)in_stack_fffffffffffffdf0 >> 0x38,0));
    std::make_unique<HuffTree::TreeNode,HuffTree::TreeNode>(in_stack_fffffffffffffde8);
    std::
    priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/src/huffman_tree.cpp:14:17)>
    ::push(in_stack_fffffffffffffe00,
           (value_type *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    TreeNode::~TreeNode((TreeNode *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    std::__detail::_Node_const_iterator<std::pair<const_char,_int>,_false,_false>::operator++
              ((_Node_const_iterator<std::pair<const_char,_int>,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  }
  local_c8 = std::
             unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
             ::size((unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
                     *)0x11a745);
  while (1 < local_c8) {
    std::
    priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/src/huffman_tree.cpp:14:17)>
    ::top((priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_jeinygroove[P]Huffman_Archiver_src_huffman_tree_cpp:14:17)>
           *)0x11a769);
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::unique_ptr
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               (unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               in_stack_fffffffffffffdd8);
    std::
    priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/src/huffman_tree.cpp:14:17)>
    ::pop(in_stack_fffffffffffffdf0);
    std::
    priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/src/huffman_tree.cpp:14:17)>
    ::top((priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_jeinygroove[P]Huffman_Archiver_src_huffman_tree_cpp:14:17)>
           *)0x11a7a4);
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::unique_ptr
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               (unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               in_stack_fffffffffffffdd8);
    std::
    priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/src/huffman_tree.cpp:14:17)>
    ::pop(in_stack_fffffffffffffdf0);
    pTVar5 = std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::
             operator->((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                        0x11a7de);
    iVar1 = pTVar5->_freq;
    pTVar5 = std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::
             operator->((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                        0x11a7f7);
    local_dc = iVar1 + pTVar5->_freq;
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::unique_ptr
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               (unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               in_stack_fffffffffffffdd8);
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::unique_ptr
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               (unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               in_stack_fffffffffffffdd8);
    TreeNode::TreeNode((TreeNode *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                       (char)((ulong)in_stack_fffffffffffffe08 >> 0x38),
                       (int)in_stack_fffffffffffffe08,
                       (unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                       in_stack_fffffffffffffe00,
                       (unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                       CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                       SUB81((ulong)in_stack_fffffffffffffdf0 >> 0x38,0));
    std::make_unique<HuffTree::TreeNode,HuffTree::TreeNode>(in_stack_fffffffffffffde8);
    std::
    priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/src/huffman_tree.cpp:14:17)>
    ::push(in_stack_fffffffffffffe00,
           (value_type *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    TreeNode::~TreeNode((TreeNode *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    local_c8 = local_c8 - 1;
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  }
  uVar3 = std::
          priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/src/huffman_tree.cpp:14:17)>
          ::empty((priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_jeinygroove[P]Huffman_Archiver_src_huffman_tree_cpp:14:17)>
                   *)0x11a9cf);
  if (!(bool)uVar3) {
    pvVar6 = std::
             priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/src/huffman_tree.cpp:14:17)>
             ::top((priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_jeinygroove[P]Huffman_Archiver_src_huffman_tree_cpp:14:17)>
                    *)0x11a9f0);
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::unique_ptr
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               (unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               in_stack_fffffffffffffdd8);
    std::
    priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/src/huffman_tree.cpp:14:17)>
    ::pop(in_stack_fffffffffffffdf0);
    sVar7 = std::
            unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
            ::size((unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
                    *)0x11aa25);
    if (sVar7 == 1) {
      puVar8 = local_120;
      pTVar5 = std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::
               operator->((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>
                           *)0x11aa40);
      in_stack_fffffffffffffde4 = pTVar5->_freq;
      __args = &local_158;
      local_124 = in_stack_fffffffffffffde4;
      std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::unique_ptr
                ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),puVar8);
      uVar9 = 0;
      is_leaf = (undefined1)((ulong)local_160 >> 0x38);
      std::unique_ptr<HuffTree::TreeNode,std::default_delete<HuffTree::TreeNode>>::
      unique_ptr<std::default_delete<HuffTree::TreeNode>,void>
                ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),puVar8);
      TreeNode::TreeNode((TreeNode *)CONCAT17(uVar3,in_stack_fffffffffffffe10),
                         (char)((ulong)pvVar6 >> 0x38),(int)pvVar6,&local_158._left,
                         (unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *
                         )CONCAT44(uVar9,in_stack_fffffffffffffdf8),(bool)is_leaf);
      std::make_unique<HuffTree::TreeNode,HuffTree::TreeNode>(__args);
      std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::operator=
                ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),puVar8);
      std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
                ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
      TreeNode::~TreeNode((TreeNode *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0))
      ;
      std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
                ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
      std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
                ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    }
    else {
      std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::operator=
                ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 (unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                 in_stack_fffffffffffffdd8);
    }
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  }
  std::
  priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/src/huffman_tree.cpp:14:17)>
  ::~priority_queue((priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_jeinygroove[P]Huffman_Archiver_src_huffman_tree_cpp:14:17)>
                     *)0x11aba9);
  return;
}

Assistant:

HuffTree::HuffTree(const std::unordered_map<char, int> &data) {
    auto comp = [](const std::unique_ptr<TreeNode> &l, const std::unique_ptr<TreeNode> &r) -> bool {
        return (l->_freq > r->_freq);
    };

    std::priority_queue<std::unique_ptr<TreeNode>,
            std::vector<std::unique_ptr<TreeNode>>,
            decltype(comp)> MinHeap(comp);

    for (auto i : data) {
        MinHeap.push(std::make_unique<TreeNode>(TreeNode(i.first, i.second, nullptr, nullptr, true)));
    }
    std::size_t size = data.size();
    while (size > 1) {
        std::unique_ptr<TreeNode> l(std::move(const_cast<std::unique_ptr<TreeNode> &>(MinHeap.top())));
        MinHeap.pop();

        std::unique_ptr<TreeNode> r(std::move(const_cast<std::unique_ptr<TreeNode> &>(MinHeap.top())));
        MinHeap.pop();

        int freq = l->_freq + r->_freq;
        MinHeap.push(std::make_unique<TreeNode>(TreeNode(' ', freq, std::move(l), std::move(r), false)));
        size--;
    }
    if (!MinHeap.empty()) {
        std::unique_ptr<TreeNode> top(std::move(const_cast<std::unique_ptr<TreeNode> &>(MinHeap.top())));
        MinHeap.pop();
        if (data.size() == 1) {
            int freq = top->_freq;
            root = std::make_unique<TreeNode>(TreeNode(' ', freq, std::move(top),
                                                       nullptr, false));
        } else {
            root = std::move(const_cast<std::unique_ptr<TreeNode> &>(top));
        }
    }
}